

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int ctl_byname(tsd_t *tsd,char *name,void *oldp,size_t *oldlenp,void *newp,size_t newlen)

{
  code *pcVar1;
  _Bool _Var2;
  int iVar3;
  size_t depth;
  size_t mib [7];
  ctl_node_t *nodes [7];
  size_t local_b0;
  size_t local_a8 [7];
  ctl_node_t *apcStack_70 [8];
  
  if ((ctl_initialized == '\0') && (_Var2 = ctl_init(tsd), _Var2)) {
    return 0xb;
  }
  local_b0 = 7;
  iVar3 = ctl_lookup((tsdn_t *)tsd,name,apcStack_70 + 1,local_a8,&local_b0);
  if (iVar3 == 0) {
    iVar3 = 2;
    if ((apcStack_70[local_b0]->named == true) &&
       (pcVar1 = *(code **)(apcStack_70[local_b0] + 0x20), pcVar1 != (code *)0x0)) {
      iVar3 = (*pcVar1)(tsd,local_a8,local_b0,oldp,oldlenp,newp,newlen);
    }
  }
  return iVar3;
}

Assistant:

int
ctl_byname(tsd_t *tsd, const char *name, void *oldp, size_t *oldlenp,
    void *newp, size_t newlen) {
	int ret;
	size_t depth;
	ctl_node_t const *nodes[CTL_MAX_DEPTH];
	size_t mib[CTL_MAX_DEPTH];
	const ctl_named_node_t *node;

	if (!ctl_initialized && ctl_init(tsd)) {
		ret = EAGAIN;
		goto label_return;
	}

	depth = CTL_MAX_DEPTH;
	ret = ctl_lookup(tsd_tsdn(tsd), name, nodes, mib, &depth);
	if (ret != 0) {
		goto label_return;
	}

	node = ctl_named_node(nodes[depth-1]);
	if (node != NULL && node->ctl) {
		ret = node->ctl(tsd, mib, depth, oldp, oldlenp, newp, newlen);
	} else {
		/* The name refers to a partial path through the ctl tree. */
		ret = ENOENT;
	}

label_return:
	return(ret);
}